

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O1

LY_ERR ly_parse_instance_predicate
                 (char **pred,size_t limit,LYD_FORMAT format,char **prefix,size_t *prefix_len,
                 char **id,size_t *id_len,char **value,size_t *value_len,char **errmsg)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  bool bVar4;
  long lVar5;
  LY_ERR LVar6;
  ushort **ppuVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  char *in;
  char *local_58;
  char **local_50;
  char **local_48;
  size_t local_40;
  size_t *local_38;
  
  pcVar11 = *pred;
  local_58 = pcVar11;
  local_40 = limit;
  if (*pcVar11 != '[') {
    __assert_fail("in[0] == \'[\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/ly_common.c"
                  ,0x362,
                  "LY_ERR ly_parse_instance_predicate(const char **, size_t, LYD_FORMAT, const char **, size_t *, const char **, size_t *, const char **, size_t *, const char **)"
                 );
  }
  *value = (char *)0x0;
  *id = (char *)0x0;
  *prefix = (char *)0x0;
  *value_len = 0;
  *id_len = 0;
  *prefix_len = 0;
  local_50 = prefix;
  local_48 = id;
  local_38 = prefix_len;
  ppuVar7 = __ctype_b_loc();
  uVar9 = 0;
  do {
    uVar10 = uVar9;
    cVar2 = pcVar11[uVar10 + 1];
    uVar3 = (*ppuVar7)[cVar2];
    uVar9 = uVar10 + 1;
  } while ((uVar3 >> 0xd & 1) != 0);
  pcVar1 = pcVar11 + uVar9;
  if ((uVar3 >> 0xb & 1) == 0) {
    if (cVar2 == '-') {
      pcVar11 = "Invalid instance predicate format (negative position or invalid node-identifier).";
      goto LAB_0010fcde;
    }
    if (cVar2 != '.') {
      local_58 = pcVar1;
      LVar6 = ly_parse_nodeid(&local_58,local_50,local_38,local_48,id_len);
      if (LVar6 == LY_SUCCESS) {
        if ((format != LYD_XML) || (*local_50 != (char *)0x0)) {
          uVar10 = (long)local_58 - (long)*pred;
          bVar4 = false;
          local_58 = *pred;
          goto LAB_0010fb5d;
        }
        pcVar11 = "Missing prefix of a node name.";
      }
      else {
        pcVar11 = "Invalid node-identifier.";
      }
      goto LAB_0010fcde;
    }
    *local_48 = pcVar1;
    *id_len = 1;
    uVar10 = uVar10 + 2;
    bVar4 = true;
LAB_0010fb5d:
    if ((uVar3 >> 0xb & 1) == 0) {
      do {
        uVar8 = uVar10;
        uVar10 = uVar8 + 1;
      } while ((*(byte *)((long)*ppuVar7 + (long)local_58[uVar8] * 2 + 1) & 0x20) != 0);
      uVar9 = uVar8 + 1;
      if (local_58[uVar8] == '=') {
        do {
          cVar2 = local_58[uVar9];
          uVar8 = uVar9 + 1;
          uVar9 = uVar8;
        } while ((*(byte *)((long)*ppuVar7 + (long)cVar2 * 2 + 1) & 0x20) != 0);
        if ((cVar2 == '\"') || (cVar2 == '\'')) {
          *value = local_58 + uVar8;
          if (uVar8 < local_40) {
            pcVar11 = local_58 + uVar8;
            uVar10 = uVar8;
            do {
              if ((*pcVar11 == cVar2) && ((uVar9 = uVar10, uVar10 == 0 || (pcVar11[-1] != '\\'))))
              break;
              uVar10 = uVar10 + 1;
              pcVar11 = pcVar11 + 1;
              uVar9 = local_40;
            } while (uVar10 < local_40);
          }
          if (local_58[uVar9] != cVar2) {
            pcVar11 = "Value is not terminated quoted-string.";
            goto LAB_0010fcde;
          }
          *value_len = uVar9 - uVar8;
          uVar10 = uVar9 + 1;
          goto LAB_0010fc03;
        }
        pcVar11 = "String value is not quoted.";
      }
      else if (bVar4) {
        pcVar11 = "Unexpected character instead of \'=\' in leaf-list-predicate.";
      }
      else {
        pcVar11 = "Unexpected character instead of \'=\' in key-predicate.";
      }
      *errmsg = pcVar11;
      LVar6 = LY_EVALID;
    }
    else {
LAB_0010fc03:
      do {
        uVar9 = uVar10;
        uVar10 = uVar9 + 1;
      } while ((*(byte *)((long)*ppuVar7 + (long)local_58[uVar9] * 2 + 1) & 0x20) != 0);
      if (local_58[uVar9] != ']') {
        if ((uVar3 >> 0xb & 1) == 0) {
          if (bVar4) {
            pcVar11 = "Predicate (leaf-list-predicate) is not terminated by \']\' character.";
          }
          else {
            pcVar11 = "Predicate (key-predicate) is not terminated by \']\' character.";
          }
        }
        else {
          pcVar11 = "Predicate (pos) is not terminated by \']\' character.";
        }
        goto LAB_0010fcde;
      }
      if (uVar10 <= local_40) {
        local_58 = local_58 + uVar10;
        LVar6 = LY_SUCCESS;
        goto LAB_0010fcef;
      }
      *errmsg = "Predicate is incomplete.";
      *value = (char *)0x0;
      *local_48 = (char *)0x0;
      *local_50 = (char *)0x0;
      *value_len = 0;
      *id_len = 0;
      *local_38 = 0;
      LVar6 = LY_EINVAL;
      uVar8 = local_40;
    }
  }
  else {
    if (cVar2 != '0') {
      *value = pcVar1;
      uVar10 = uVar9;
      do {
        lVar5 = uVar10 + 1;
        uVar10 = uVar10 + 1;
      } while ((*(byte *)((long)*ppuVar7 + (long)pcVar11[lVar5] * 2 + 1) & 8) != 0);
      *value_len = uVar10 - uVar9;
      bVar4 = false;
      goto LAB_0010fb5d;
    }
    pcVar11 = "The position predicate cannot be zero.";
LAB_0010fcde:
    *errmsg = pcVar11;
    LVar6 = LY_EVALID;
    uVar8 = uVar9;
  }
  local_58 = local_58 + uVar8;
LAB_0010fcef:
  *pred = local_58;
  return LVar6;
}

Assistant:

LY_ERR
ly_parse_instance_predicate(const char **pred, size_t limit, LYD_FORMAT format,
        const char **prefix, size_t *prefix_len, const char **id, size_t *id_len, const char **value, size_t *value_len,
        const char **errmsg)
{
    LY_ERR ret = LY_EVALID;
    const char *in = *pred;
    size_t offset = 1;
    uint8_t expr = 0; /* 0 - position predicate; 1 - leaf-list-predicate; 2 - key-predicate */
    char quot;

    assert(in[0] == '[');

    *prefix = *id = *value = NULL;
    *prefix_len = *id_len = *value_len = 0;

    /* leading *WSP */
    for ( ; isspace(in[offset]); offset++) {}

    if (isdigit(in[offset])) {
        /* pos: "[" *WSP positive-integer-value *WSP "]" */
        if (in[offset] == '0') {
            /* zero */
            *errmsg = "The position predicate cannot be zero.";
            goto error;
        }

        /* positive-integer-value */
        *value = &in[offset++];
        for ( ; isdigit(in[offset]); offset++) {}
        *value_len = &in[offset] - *value;

    } else if (in[offset] == '.') {
        /* leaf-list-predicate: "[" *WSP "." *WSP "=" *WSP quoted-string *WSP "]" */
        *id = &in[offset];
        *id_len = 1;
        offset++;
        expr = 1;
    } else if (in[offset] == '-') {
        /* typically negative value */
        *errmsg = "Invalid instance predicate format (negative position or invalid node-identifier).";
        goto error;
    } else {
        /* key-predicate: "[" *WSP node-identifier *WSP "=" *WSP quoted-string *WSP "]" */
        in = &in[offset];
        if (ly_parse_nodeid(&in, prefix, prefix_len, id, id_len)) {
            *errmsg = "Invalid node-identifier.";
            goto error;
        }
        if ((format == LYD_XML) && !(*prefix)) {
            /* all node names MUST be qualified with explicit namespace prefix */
            *errmsg = "Missing prefix of a node name.";
            goto error;
        }
        offset = in - *pred;
        in = *pred;
        expr = 2;
    }

    if (expr) {
        /*  *WSP "=" *WSP quoted-string *WSP "]" */
        for ( ; isspace(in[offset]); offset++) {}

        if (in[offset] != '=') {
            if (expr == 1) {
                *errmsg = "Unexpected character instead of \'=\' in leaf-list-predicate.";
            } else { /* 2 */
                *errmsg = "Unexpected character instead of \'=\' in key-predicate.";
            }
            goto error;
        }
        offset++;
        for ( ; isspace(in[offset]); offset++) {}

        /* quoted-string */
        quot = in[offset++];
        if ((quot != '\'') && (quot != '\"')) {
            *errmsg = "String value is not quoted.";
            goto error;
        }
        *value = &in[offset];
        for ( ; offset < limit && (in[offset] != quot || (offset && in[offset - 1] == '\\')); offset++) {}
        if (in[offset] == quot) {
            *value_len = &in[offset] - *value;
            offset++;
        } else {
            *errmsg = "Value is not terminated quoted-string.";
            goto error;
        }
    }

    /* *WSP "]" */
    for ( ; isspace(in[offset]); offset++) {}
    if (in[offset] != ']') {
        if (expr == 0) {
            *errmsg = "Predicate (pos) is not terminated by \']\' character.";
        } else if (expr == 1) {
            *errmsg = "Predicate (leaf-list-predicate) is not terminated by \']\' character.";
        } else { /* 2 */
            *errmsg = "Predicate (key-predicate) is not terminated by \']\' character.";
        }
        goto error;
    }
    offset++;

    if (offset <= limit) {
        *pred = &in[offset];
        return LY_SUCCESS;
    }

    /* we read after the limit */
    *errmsg = "Predicate is incomplete.";
    *prefix = *id = *value = NULL;
    *prefix_len = *id_len = *value_len = 0;
    offset = limit;
    ret = LY_EINVAL;

error:
    *pred = &in[offset];
    return ret;
}